

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::percolateDown
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int i)

{
  Var y;
  int iVar1;
  bool bVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  y = (this->heap).data[i];
  while( true ) {
    iVar5 = i * 2 + 1;
    iVar1 = (this->heap).sz;
    if (iVar1 <= iVar5) break;
    iVar6 = i * 2 + 2;
    if (iVar6 < iVar1) {
      piVar3 = (this->heap).data;
      bVar2 = SimpSolver::ElimLt::operator()(&this->lt,piVar3[iVar6],piVar3[iVar5]);
      lVar4 = (long)iVar6;
      if (!bVar2) {
        lVar4 = (long)iVar5;
        iVar6 = iVar5;
      }
    }
    else {
      lVar4 = (long)iVar5;
      iVar6 = iVar5;
    }
    bVar2 = SimpSolver::ElimLt::operator()(&this->lt,(this->heap).data[lVar4],y);
    piVar3 = (this->heap).data;
    if (!bVar2) goto LAB_00112f2e;
    iVar1 = piVar3[lVar4];
    piVar3[i] = iVar1;
    piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,iVar1);
    *piVar3 = i;
    i = iVar6;
  }
  piVar3 = (this->heap).data;
LAB_00112f2e:
  piVar3[i] = y;
  piVar3 = IntMap<int,_int,_Minisat::MkIndexDefault<int>_>::operator[](&this->indices,y);
  *piVar3 = i;
  return;
}

Assistant:

void percolateDown(int i)
    {
        K x = heap[i];
        while (left(i) < heap.size()){
            int child = right(i) < heap.size() && lt(heap[right(i)], heap[left(i)]) ? right(i) : left(i);
            if (!lt(heap[child], x)) break;
            heap[i]          = heap[child];
            indices[heap[i]] = i;
            i                = child;
        }
        heap   [i] = x;
        indices[x] = i;
    }